

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseAssembler::embedLabelDelta(BaseAssembler *this,Label *label,Label *base,size_t dataSize)

{
  uint uVar1;
  uint uVar2;
  CodeHolder *pCVar3;
  Logger *pLVar4;
  uint8_t *puVar5;
  Section *pSVar6;
  long lVar7;
  Error EVar8;
  U v;
  ulong uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  Label *pLVar14;
  undefined8 uVar15;
  Error err;
  uint8_t *__s;
  char cVar16;
  ulong uVar17;
  StringTmp<256UL> sb;
  Label *local_170;
  Label *local_168;
  ulong local_160;
  anon_union_32_4_a21e1b61_for_String_0 local_158;
  char local_138 [264];
  
  pCVar3 = (this->super_BaseEmitter)._code;
  if (pCVar3 == (CodeHolder *)0x0) {
    EVar8 = 5;
  }
  else {
    uVar1 = (label->super_Operand).super_Operand_._baseId;
    uVar2 = (pCVar3->_labelEntries).super_ZoneVectorBase._size;
    if (uVar1 < uVar2) {
      uVar12 = *(ulong *)((long)(pCVar3->_labelEntries).super_ZoneVectorBase._data +
                         (ulong)uVar1 * 8);
    }
    else {
      uVar12 = 0;
    }
    uVar1 = (base->super_Operand).super_Operand_._baseId;
    if (uVar1 < uVar2) {
      pLVar14 = *(Label **)
                 ((long)(pCVar3->_labelEntries).super_ZoneVectorBase._data + (ulong)uVar1 * 8);
    }
    else {
      pLVar14 = (Label *)0x0;
    }
    if ((uVar12 == 0) || (pLVar14 == (Label *)0x0)) {
      EVar8 = 0xc;
    }
    else {
      uVar17 = (ulong)(((this->super_BaseEmitter)._environment._arch & 1) == 0) * 4 + 4;
      if (dataSize != 0) {
        uVar17 = dataSize;
      }
      if ((uVar17 < 9) &&
         (uVar9 = uVar17 - (uVar17 >> 1 & 0x5555555555555555),
         uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333),
         (byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) {
        __s = this->_bufferPtr;
        EVar8 = 0;
        uVar9 = uVar12;
        if ((ulong)((long)this->_bufferEnd - (long)__s) < uVar17) {
          EVar8 = CodeHolder::growBuffer(pCVar3,&this->_section->_buffer,uVar17);
          uVar9 = (ulong)EVar8;
          local_170 = base;
          local_168 = pLVar14;
          local_160 = uVar12;
          if (EVar8 != 0) goto LAB_001127c6;
          __s = this->_bufferPtr;
          err = 0;
          EVar8 = 0;
          goto LAB_0011277c;
        }
        do {
          if (EVar8 != 0) {
            return EVar8;
          }
          if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
            local_158._large.data = local_138;
            local_158._large.size = 0;
            local_158._0_8_ = 0x20;
            local_158._large.capacity = 0x107;
            local_138[0] = '\0';
            lVar7 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            String::_opFormat((String *)&local_158._small,1,".%s (",dataSizeByPowerTable + lVar7 * 4
                             );
            Formatter::formatLabel
                      ((String *)&local_158._small,0,&this->super_BaseEmitter,
                       (label->super_Operand).super_Operand_._baseId);
            String::_opString((String *)&local_158._small,1," - ",0xffffffffffffffff);
            Formatter::formatLabel
                      ((String *)&local_158._small,0,&this->super_BaseEmitter,
                       (base->super_Operand).super_Operand_._baseId);
            String::_opString((String *)&local_158._small,1,")\n",0xffffffffffffffff);
            pLVar4 = (this->super_BaseEmitter)._logger;
            uVar13 = local_158._large.size;
            uVar15 = local_158._large.data;
            if ((local_158._0_8_ & 0xff) < 0x1f) {
              uVar13 = local_158._0_8_ & 0xff;
              uVar15 = local_158._small.data;
            }
            (*pLVar4->_vptr_Logger[2])(pLVar4,uVar15,uVar13);
            String::reset((String *)&local_158._small);
            local_170 = base;
            local_168 = pLVar14;
            local_160 = uVar9;
          }
          if ((*(long *)(uVar9 + 0x20) == 0) ||
             (lVar7._0_4_ = pLVar14[2].super_Operand.super_Operand_._signature,
             lVar7._4_4_ = pLVar14[2].super_Operand.super_Operand_._baseId,
             *(long *)(uVar9 + 0x20) != lVar7)) {
            EVar8 = CodeHolder::newRelocEntry
                              ((this->super_BaseEmitter)._code,(RelocEntry **)&local_158,1);
            if (EVar8 == 0) {
              pCVar3 = (this->super_BaseEmitter)._code;
              puVar5 = (pCVar3->_zone)._end;
              puVar10 = (uint8_t *)((ulong)((pCVar3->_zone)._ptr + 7) & 0xfffffffffffffff8);
              if (puVar10 < puVar5 && 0x17 < (ulong)((long)puVar5 - (long)puVar10)) {
                (pCVar3->_zone)._ptr = puVar10 + 0x18;
              }
              else {
                puVar10 = (uint8_t *)Zone::_alloc(&pCVar3->_zone,0x18,8);
              }
              if (puVar10 == (uint8_t *)0x0) {
                puVar10 = (uint8_t *)0x0;
              }
              else {
                puVar10[0] = '\0';
                puVar10[1] = '\0';
                puVar10[2] = '\0';
                puVar10[3] = '\0';
                puVar10[4] = '\0';
                puVar10[5] = '\0';
                puVar10[6] = '\0';
                puVar10[7] = '\0';
                puVar10[8] = '\0';
                puVar10[9] = '\0';
                puVar10[10] = '\0';
                puVar10[0xb] = '\0';
                puVar10[0xc] = '\0';
                puVar10[0xd] = '\0';
                puVar10[0xe] = '\0';
                puVar10[0xf] = '\0';
                puVar10[0x10] = '\0';
                puVar10[0x11] = '\0';
                puVar10[0x12] = '\0';
                puVar10[0x13] = '\0';
                puVar10[0x14] = '\0';
                puVar10[0x15] = '\0';
                puVar10[0x16] = '\0';
                puVar10[0x17] = '\0';
              }
              if (puVar10 == (uint8_t *)0x0) {
                EVar8 = 1;
                goto LAB_001127b3;
              }
              puVar10[0] = '\0';
              puVar10[1] = '\0';
              puVar10[2] = '\0';
              puVar10[3] = '\0';
              puVar10[4] = '\0';
              puVar10[5] = '\0';
              puVar10[6] = '\0';
              puVar10[7] = '\0';
              puVar10[8] = '\0';
              puVar10[9] = '\0';
              puVar10[10] = '\0';
              puVar10[0xb] = '\0';
              puVar10[0xc] = '\0';
              puVar10[0xd] = '\0';
              puVar10[0xe] = '\0';
              puVar10[0xf] = '\0';
              puVar10[0] = '\x01';
              puVar10[1] = '\x02';
              *(ulong *)(puVar10 + 8) = uVar9;
              puVar10[2] = '\x02';
              *(Label **)(puVar10 + 0x10) = pLVar14;
              *(undefined2 *)(local_158._0_8_ + 8) = 0;
              cVar16 = (char)uVar17;
              *(char *)(local_158._0_8_ + 10) = cVar16;
              *(char *)(local_158._0_8_ + 0xb) = cVar16;
              *(undefined1 *)(local_158._0_8_ + 0xc) = 0;
              *(char *)(local_158._0_8_ + 0xd) = cVar16 * '\b';
              *(undefined2 *)(local_158._0_8_ + 0xe) = 0;
              *(uint32_t *)(local_158._0_8_ + 0x10) = this->_section->_id;
              *(long *)(local_158._0_8_ + 0x18) = (long)this->_bufferPtr - (long)this->_bufferData;
              *(uint8_t **)(local_158._0_8_ + 0x20) = puVar10;
              memset(__s,0,uVar17);
              __s = __s + uVar17;
              uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
              EVar8 = 0;
            }
            else {
LAB_001127b3:
              uVar17 = 0;
              EVar8 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar8,(char *)0x0);
            }
            label = pLVar14;
            if ((char)uVar17 == '\0') {
              return EVar8;
            }
          }
          else {
            uVar12 = *(long *)(uVar9 + 0x18) -
                     *(long *)pLVar14[1].super_Operand.super_Operand_._data;
            uVar11 = 0;
            do {
              __s[uVar11] = (uint8_t)uVar12;
              uVar12 = uVar12 >> 8;
              uVar11 = uVar11 + 1;
            } while (uVar17 != uVar11);
            __s = __s + uVar17;
          }
          pSVar6 = this->_section;
          uVar12 = (long)__s - (long)this->_bufferData;
          if (uVar12 <= (pSVar6->_buffer)._capacity) {
            this->_bufferPtr = __s;
            uVar17 = (pSVar6->_buffer)._size;
            if (uVar12 < uVar17) {
              uVar12 = uVar17;
            }
            (pSVar6->_buffer)._size = uVar12;
            return 0;
          }
          embedLabelDelta();
LAB_001127c6:
          err = (Error)uVar9;
          EVar8 = BaseEmitter::reportError(&this->super_BaseEmitter,err,(char *)0x0);
LAB_0011277c:
          pLVar14 = local_168;
          base = local_170;
          uVar9 = local_160;
          if (err == 0) {
            EVar8 = 0;
          }
        } while( true );
      }
      EVar8 = 0x34;
    }
  }
  EVar8 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar8,(char *)0x0);
  return EVar8;
}

Assistant:

Error BaseAssembler::embedLabelDelta(const Label& label, const Label& base, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  LabelEntry* labelEntry = _code->labelEntry(label);
  LabelEntry* baseEntry = _code->labelEntry(base);

  if (ASMJIT_UNLIKELY(!labelEntry || !baseEntry))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  if (dataSize == 0)
    dataSize = registerSize();

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(dataSize) || dataSize > 8))
    return reportError(DebugUtils::errored(kErrorInvalidOperandSize));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<256> sb;
    sb.appendFormat(".%s (", dataSizeByPowerTable[Support::ctz(dataSize)].str);
    Formatter::formatLabel(sb, 0, this, label.id());
    sb.append(" - ");
    Formatter::formatLabel(sb, 0, this, base.id());
    sb.append(")\n");
    _logger->log(sb);
  }
#endif

  // If both labels are bound within the same section it means the delta can be calculated now.
  if (labelEntry->isBound() && baseEntry->isBound() && labelEntry->section() == baseEntry->section()) {
    uint64_t delta = labelEntry->offset() - baseEntry->offset();
    writer.emitValueLE(delta, dataSize);
  }
  else {
    RelocEntry* re;
    Error err = _code->newRelocEntry(&re, RelocEntry::kTypeExpression);
    if (ASMJIT_UNLIKELY(err))
      return reportError(err);

    Expression* exp = _code->_zone.newT<Expression>();
    if (ASMJIT_UNLIKELY(!exp))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));

    exp->reset();
    exp->opType = Expression::kOpSub;
    exp->setValueAsLabel(0, labelEntry);
    exp->setValueAsLabel(1, baseEntry);

    re->_format.resetToDataValue(dataSize);
    re->_sourceSectionId = _section->id();
    re->_sourceOffset = offset();
    re->_payload = (uint64_t)(uintptr_t)exp;

    writer.emitZeros(dataSize);
  }

  writer.done(this);
  return kErrorOk;
}